

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Imputer::Imputer(Imputer *this,Imputer *from)

{
  uint32 uVar1;
  void *pvVar2;
  Int64Vector *this_00;
  DoubleVector *pDVar3;
  ImputedValueUnion IVar4;
  StringToDoubleMap *this_01;
  Int64ToDoubleMap *this_02;
  Int64Vector *from_00;
  DoubleVector *from_01;
  StringToDoubleMap *from_02;
  Int64ToDoubleMap *from_03;
  ReplaceValueUnion RVar5;
  ImputedValueUnion IVar6;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Imputer_00427070;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  switch(uVar1) {
  case 1:
    IVar6 = from->ImputedValue_;
    clear_ImputedValue(this);
    if (uVar1 != 1) {
      IVar6.imputeddoublevalue_ = 0.0;
    }
    this->_oneof_case_[0] = 1;
    this->ImputedValue_ = IVar6;
    break;
  case 2:
    IVar6 = from->ImputedValue_;
    clear_ImputedValue(this);
    IVar4.imputeddoublevalue_ = 0.0;
    if (uVar1 == 2) {
      IVar4 = IVar6;
    }
    this->_oneof_case_[0] = 2;
    (this->ImputedValue_).imputeddoublevalue_ = (double)IVar4;
    break;
  case 3:
    pDVar3 = (from->ImputedValue_).imputeddoublearray_;
    clear_ImputedValue(this);
    if (uVar1 != 3) {
      pDVar3 = (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    this->_oneof_case_[0] = 3;
    (this->ImputedValue_).imputeddoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->ImputedValue_).imputedstringvalue_,(string *)pDVar3);
    break;
  case 4:
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 4;
    pDVar3 = (DoubleVector *)operator_new(0x28);
    DoubleVector::DoubleVector(pDVar3);
    (this->ImputedValue_).imputeddoublearray_ = pDVar3;
    if (from->_oneof_case_[0] == 4) {
      from_01 = (from->ImputedValue_).imputeddoublearray_;
    }
    else {
      from_01 = DoubleVector::default_instance();
    }
    DoubleVector::MergeFrom(pDVar3,from_01);
    break;
  case 5:
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 5;
    this_00 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_00);
    (this->ImputedValue_).imputedint64array_ = this_00;
    if (from->_oneof_case_[0] == 5) {
      from_00 = (from->ImputedValue_).imputedint64array_;
    }
    else {
      from_00 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(this_00,from_00);
    break;
  case 6:
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 6;
    this_01 = (StringToDoubleMap *)operator_new(0x38);
    StringToDoubleMap::StringToDoubleMap(this_01);
    (this->ImputedValue_).imputedstringdictionary_ = this_01;
    if (from->_oneof_case_[0] == 6) {
      from_02 = (from->ImputedValue_).imputedstringdictionary_;
    }
    else {
      from_02 = StringToDoubleMap::default_instance();
    }
    StringToDoubleMap::MergeFrom(this_01,from_02);
    break;
  case 7:
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 7;
    this_02 = (Int64ToDoubleMap *)operator_new(0x38);
    Int64ToDoubleMap::Int64ToDoubleMap(this_02);
    (this->ImputedValue_).imputedint64dictionary_ = this_02;
    if (from->_oneof_case_[0] == 7) {
      from_03 = (from->ImputedValue_).imputedint64dictionary_;
    }
    else {
      from_03 = Int64ToDoubleMap::default_instance();
    }
    Int64ToDoubleMap::MergeFrom(this_02,from_03);
  }
  this->_oneof_case_[1] = 0;
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0xd) {
    RVar5.replacedoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    if (uVar1 == 0xd) {
      RVar5 = from->ReplaceValue_;
    }
    clear_ReplaceValue(this);
    this->_oneof_case_[1] = 0xd;
    (this->ReplaceValue_).replacedoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&(this->ReplaceValue_).replacestringvalue_,(string *)RVar5);
  }
  else if (uVar1 == 0xc) {
    if (uVar1 == 0xc) {
      RVar5 = from->ReplaceValue_;
    }
    else {
      RVar5.replacedoublevalue_ = 0.0;
    }
    clear_ReplaceValue(this);
    this->_oneof_case_[1] = 0xc;
    this->ReplaceValue_ = RVar5;
  }
  else if (uVar1 == 0xb) {
    if (uVar1 == 0xb) {
      RVar5 = from->ReplaceValue_;
    }
    else {
      RVar5.replacedoublevalue_ = 0.0;
    }
    clear_ReplaceValue(this);
    this->_oneof_case_[1] = 0xb;
    (this->ReplaceValue_).replacedoublevalue_ = (double)RVar5;
  }
  return;
}

Assistant:

Imputer::Imputer(const Imputer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_ImputedValue();
  switch (from.ImputedValue_case()) {
    case kImputedDoubleValue: {
      set_imputeddoublevalue(from.imputeddoublevalue());
      break;
    }
    case kImputedInt64Value: {
      set_imputedint64value(from.imputedint64value());
      break;
    }
    case kImputedStringValue: {
      set_imputedstringvalue(from.imputedstringvalue());
      break;
    }
    case kImputedDoubleArray: {
      mutable_imputeddoublearray()->::CoreML::Specification::DoubleVector::MergeFrom(from.imputeddoublearray());
      break;
    }
    case kImputedInt64Array: {
      mutable_imputedint64array()->::CoreML::Specification::Int64Vector::MergeFrom(from.imputedint64array());
      break;
    }
    case kImputedStringDictionary: {
      mutable_imputedstringdictionary()->::CoreML::Specification::StringToDoubleMap::MergeFrom(from.imputedstringdictionary());
      break;
    }
    case kImputedInt64Dictionary: {
      mutable_imputedint64dictionary()->::CoreML::Specification::Int64ToDoubleMap::MergeFrom(from.imputedint64dictionary());
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  clear_has_ReplaceValue();
  switch (from.ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      set_replacedoublevalue(from.replacedoublevalue());
      break;
    }
    case kReplaceInt64Value: {
      set_replaceint64value(from.replaceint64value());
      break;
    }
    case kReplaceStringValue: {
      set_replacestringvalue(from.replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Imputer)
}